

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O2

void qpdf_get_buffer_internal(qpdf_data qpdf)

{
  __shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  if ((qpdf->write_memory == true) &&
     ((qpdf->output_buffer).super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0)) {
    QPDFWriter::getBufferSharedPointer((QPDFWriter *)&local_20);
    std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(qpdf->output_buffer).super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>,
               &local_20);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  }
  return;
}

Assistant:

static void
qpdf_get_buffer_internal(qpdf_data qpdf)
{
    if (qpdf->write_memory && (qpdf->output_buffer == nullptr)) {
        qpdf->output_buffer = qpdf->qpdf_writer->getBufferSharedPointer();
    }
}